

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::SubstrateMaterial::readFrom(SubstrateMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kd);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->ks);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_ks);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
  BinaryReader::read<float,void>(binary,&this->uRoughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_uRoughness);
  BinaryReader::read<float,void>(binary,&this->vRoughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_vRoughness);
  BinaryReader::read<bool,void>(binary,&this->remapRoughness);
  return;
}

Assistant:

void SubstrateMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kd);
    binary.read(map_kd);
    binary.read(ks);
    binary.read(map_ks);
    binary.read(map_bump);
    binary.read(uRoughness);
    binary.read(map_uRoughness);
    binary.read(vRoughness);
    binary.read(map_vRoughness);
    binary.read(remapRoughness);
  }